

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa_minimization.cpp
# Opt level: O0

void __thiscall
DFATest_CycleGrouped_Test::~DFATest_CycleGrouped_Test(DFATest_CycleGrouped_Test *this)

{
  DFATest_CycleGrouped_Test *this_local;
  
  ~DFATest_CycleGrouped_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(DFATest, CycleGrouped) {
  // All the states are identical, so the the partition shouldn't change.
  State a{"A", {"B"}};
  State b{"B", {"C"}};
  State c{"C", {"A"}};
  Graph graph = {{a, b, c}};
  auto results = DFA::refinePartitions(graph);
  validate(graph, results);
  EXPECT_EQ(settify(results), (SetResults{{"A", "B", "C"}}));
}